

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall
IO::momentsNicking(IO *this,vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims,
                  string *filename)

{
  ModelInstance *pMVar1;
  bool bVar2;
  reference ppMVar3;
  ostream *poVar4;
  ModelInstance *model;
  iterator __end1;
  iterator __begin1;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *__range1;
  string local_220 [8];
  ofstream outstream;
  string *filename_local;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims_local;
  IO *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)filename);
  __end1 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::begin(sims);
  model = (ModelInstance *)std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::end(sims)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
                                *)&model);
    if (!bVar2) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
              ::operator*(&__end1);
    pMVar1 = *ppMVar3;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_220,pMVar1->nick1);
    poVar4 = std::operator<<(poVar4,"\t");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pMVar1->nick2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void IO::momentsNicking(std::vector<ModelInstance*> sims, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (ModelInstance* model: sims){
		outstream << model->nick1 << "\t" << model->nick2 << std::endl;
	}
	outstream.close();
}